

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

uint __thiscall
QTlsPrivate::TlsCryptographOpenSSL::pskClientTlsCallback
          (TlsCryptographOpenSSL *this,char *hint,char *identity,uint max_identity_len,uchar *psk,
          uint max_psk_len)

{
  bool bVar1;
  size_t sVar2;
  Promoted<long_long,_int> PVar3;
  char *pcVar4;
  uint in_ECX;
  void *in_RDX;
  char *in_RSI;
  long in_RDI;
  void *in_R8;
  uint in_R9D;
  long in_FS_OFFSET;
  int pskLength;
  int identityLength;
  int hintLength;
  QSslPreSharedKeyAuthenticator authenticator;
  int local_fc;
  uint local_ac;
  int local_8c;
  QByteArray local_88;
  qsizetype local_70 [4];
  int local_4c;
  QByteArray local_48;
  qsizetype local_30 [4];
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSslPreSharedKeyAuthenticator::QSslPreSharedKeyAuthenticator
            ((QSslPreSharedKeyAuthenticator *)&local_10);
  if (in_RSI == (char *)0x0) {
    local_fc = 0;
  }
  else {
    sVar2 = strlen(in_RSI);
    local_fc = (int)sVar2;
  }
  QTlsBackend::setupClientPskAuth
            ((QSslPreSharedKeyAuthenticator *)&local_10,in_RSI,local_fc,in_ECX,in_R9D);
  QSslSocket::preSharedKeyAuthenticationRequired(*(QSslPreSharedKeyAuthenticator **)(in_RDI + 0x10))
  ;
  QSslPreSharedKeyAuthenticator::preSharedKey();
  bVar1 = QByteArray::isEmpty((QByteArray *)0x15592e);
  QByteArray::~QByteArray((QByteArray *)0x15593f);
  if (bVar1) {
    local_ac = 0;
  }
  else {
    QSslPreSharedKeyAuthenticator::identity();
    local_30[0] = QByteArray::size(&local_48);
    local_4c = QSslPreSharedKeyAuthenticator::maximumIdentityLength();
    PVar3 = qMin<long_long,int>(local_30,&local_4c);
    QByteArray::~QByteArray((QByteArray *)0x1559c2);
    QSslPreSharedKeyAuthenticator::identity();
    pcVar4 = QByteArray::constData((QByteArray *)0x1559f6);
    memcpy(in_RDX,pcVar4,(long)(int)PVar3);
    QByteArray::~QByteArray((QByteArray *)0x155a15);
    *(undefined1 *)((long)in_RDX + (long)(int)PVar3) = 0;
    QSslPreSharedKeyAuthenticator::preSharedKey();
    local_70[0] = QByteArray::size(&local_88);
    local_8c = QSslPreSharedKeyAuthenticator::maximumPreSharedKeyLength();
    PVar3 = qMin<long_long,int>(local_70,&local_8c);
    local_ac = (uint)PVar3;
    QByteArray::~QByteArray((QByteArray *)0x155a87);
    QSslPreSharedKeyAuthenticator::preSharedKey();
    pcVar4 = QByteArray::constData((QByteArray *)0x155abb);
    memcpy(in_R8,pcVar4,(long)(int)local_ac);
    QByteArray::~QByteArray((QByteArray *)0x155ada);
  }
  QSslPreSharedKeyAuthenticator::~QSslPreSharedKeyAuthenticator
            ((QSslPreSharedKeyAuthenticator *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_ac;
  }
  __stack_chk_fail();
}

Assistant:

unsigned TlsCryptographOpenSSL::pskClientTlsCallback(const char *hint, char *identity,
                                                     unsigned max_identity_len,
                                                     unsigned char *psk, unsigned max_psk_len)
{
    Q_ASSERT(q);

    QSslPreSharedKeyAuthenticator authenticator;
    // Fill in some read-only fields (for the user)
    const int hintLength = hint ? int(std::strlen(hint)) : 0;
    QTlsBackend::setupClientPskAuth(&authenticator, hint, hintLength, max_identity_len, max_psk_len);
    // Let the client provide the remaining bits...
    emit q->preSharedKeyAuthenticationRequired(&authenticator);

    // No PSK set? Return now to make the handshake fail
    if (authenticator.preSharedKey().isEmpty())
        return 0;

    // Copy data back into OpenSSL
    const int identityLength = qMin(authenticator.identity().size(), authenticator.maximumIdentityLength());
    std::memcpy(identity, authenticator.identity().constData(), identityLength);
    identity[identityLength] = 0;

    const int pskLength = qMin(authenticator.preSharedKey().size(), authenticator.maximumPreSharedKeyLength());
    std::memcpy(psk, authenticator.preSharedKey().constData(), pskLength);
    return pskLength;
}